

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-math.h
# Opt level: O3

shared_ptr<RoomBase> RoomMath::getMathAddBR(element_type *param_1)

{
  undefined8 *puVar1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 auVar3 [16];
  double dVar4;
  shared_ptr<RoomBase> sVar5;
  anon_class_1_0_00000001 local_21;
  
  puVar1 = (undefined8 *)operator_new(0xf8);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00112af8;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = puVar1 + 6;
  puVar1[6] = 0x776f6e6b6e755f5f;
  *(undefined4 *)((long)puVar1 + 0x37) = 0x5f5f6e77;
  puVar1[5] = 0xb;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 1000;
  puVar1[0xf] = 20000;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0;
  puVar1[0x14] = 0;
  puVar1[0x15] = 0;
  puVar1[0x16] = 0;
  puVar1[0x17] = 0;
  puVar1[0x18] = 0;
  puVar1[0x19] = 0;
  puVar1[0x1a] = 0;
  puVar1[2] = &PTR_generate_00112b48;
  puVar1[0x1d] = 0;
  puVar1[0x1e] = 0;
  puVar1[0x1b] = 0;
  puVar1[0x1c] = 0;
  *(undefined4 *)((long)puVar1 + 0x1c) = 1;
  std::__cxx11::string::_M_replace((ulong)(puVar1 + 4),0,(char *)0xb,0x10e65e);
  *(undefined4 *)((long)puVar1 + 0x44) = 0x1e;
  if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
    getMathAddBR();
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  lVar2 = lVar2 / 1000000 - anon_unknown.dwarf_10dbb::timestamp_s::tStart;
  auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar3._0_8_ = lVar2;
  auVar3._12_4_ = 0x45300000;
  dVar4 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 0.001;
  puVar1[9] = dVar4;
  puVar1[0xb] = 0x402e000000000000;
  puVar1[0xc] = 0x402e000000000000;
  puVar1[10] = dVar4 + -15.0;
  std::function<std::pair<std::__cxx11::string,std::__cxx11::string>(int,int)>::operator=
            ((function<std::pair<std::__cxx11::string,std::__cxx11::string>(int,int)> *)
             (puVar1 + 0x1b),&local_21);
  param_1->_vptr_RoomBase = (_func_int **)(puVar1 + 2);
  *(undefined8 **)&param_1->id = puVar1;
  sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = param_1;
  return (shared_ptr<RoomBase>)sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getMathAddBR(Parameters parameters) {
        auto result = std::make_shared<RoomMath>();

        result->mode = BattleRoyale;
        result->name = "Math [+,BR]";
        result->poolSize = 30;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 0.25f*60.f;
        result->tBRRoundLength_s = 0.25f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        result->getQuery = [](int a, int b) -> std::pair<std::string, std::string> {
            return {
                std::to_string(a) + "+" + std::to_string(b),
                std::to_string(a+b),
            };
        };

        return result;
    }